

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O0

uint capnp::_::anon_unknown_0::StructListChecker::check<capnp::FlatArrayMessageReader>
               (FlatArrayMessageReader *message)

{
  uint uVar1;
  char *pcVar2;
  char c;
  char *__end0;
  char *__begin0;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> *local_58;
  Reader *__range4;
  size_t i;
  Reader l;
  uint result;
  FlatArrayMessageReader *message_local;
  
  l.reader._44_4_ = 0;
  MessageReader::getRoot<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((Reader *)&i,(MessageReader *)message);
  uVar1 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&i);
  for (__range4 = (Reader *)(ulong)uVar1; __range4 != (Reader *)0x0;
      __range4 = (Reader *)((long)&__range4[-1].super_StringPtr.content.size_ + 7)) {
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&__begin0,(Reader *)&i,(int)__range4 - 1);
    local_68 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)&__begin0);
    local_58 = &local_68;
    __end0 = kj::StringPtr::begin((StringPtr *)local_58);
    pcVar2 = kj::StringPtr::end((StringPtr *)local_58);
    for (; __end0 != pcVar2; __end0 = __end0 + 1) {
      l.reader._44_4_ = (int)*__end0 + l.reader._44_4_;
    }
  }
  return l.reader._44_4_;
}

Assistant:

static uint check(ReaderOrBuilder& message) {
    uint result = 0;
    auto l = message.template getRoot<List<TestAllTypes>>();
    for (size_t i = l.size(); i > 0; i--) {
      for (auto c: l[i-1].getTextField()) {
        result += c;
      }
    }
    return result;
  }